

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::numbers_internal::safe_strto128_base
          (numbers_internal *this,string_view text,Nonnull<int128_*> value,int base)

{
  char cVar1;
  long lVar2;
  int128 other;
  int128 other_00;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  ulong *puVar6;
  long unaff_RBP;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  numbers_internal *pnVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined7 in_stack_ffffffffffffff78;
  bool in_stack_ffffffffffffff7f;
  int128 local_78;
  ulong local_68;
  long local_60;
  ulong local_58;
  numbers_internal *local_50;
  uint local_44;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  puVar6 = (ulong *)text._M_str;
  local_40._M_str = (char *)text._M_len;
  local_44 = (uint)value;
  *puVar6 = 0;
  puVar6[1] = 0;
  local_40._M_len = (size_t)this;
  bVar4 = anon_unknown_0::safe_parse_sign_and_base
                    (&local_40,(Nonnull<int_*>)&local_44,(Nonnull<bool_*>)&stack0xffffffffffffff7f);
  pnVar12 = (numbers_internal *)local_40._M_str;
  uVar3 = local_44;
  if (bVar4) {
    local_50 = (numbers_internal *)local_40._M_len;
    local_58 = (ulong)(int)local_44;
    if (in_stack_ffffffffffffff7f == false) {
      local_78.v_._0_8_ = 0;
      local_78.v_._8_8_ = 0;
      if ((int)local_44 < 0) {
        __assert_fail("base >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/numbers.cc"
                      ,0x3db,
                      "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::int128]"
                     );
      }
      auVar13 = *(undefined1 (*) [16])
                 (lts_20250127::(anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::
                  kVmaxOverBase + (ulong)local_44 * 0x10);
      auVar14 = *(undefined1 (*) [16])
                 (lts_20250127::(anonymous_namespace)::LookupTables<absl::lts_20250127::int128>::
                  kVmaxOverBase + (ulong)local_44 * 0x10);
      if ((1 < local_44) &&
         (auVar13 = __udivti3(0xffffffffffffffff,0x7fffffffffffffff,local_58), auVar13 != auVar14))
      {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/numbers.cc"
                      ,0x3e0,
                      "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::int128]"
                     );
      }
      lVar8 = auVar13._8_8_;
      local_50 = local_50 + (long)pnVar12;
      uVar5 = 0;
      local_60 = (long)local_58 >> 0x3f;
      uVar9 = 0;
      for (; uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_50 <= pnVar12), local_50 > pnVar12
          ; pnVar12 = pnVar12 + 1) {
        uVar11 = (ulong)(char)lts_20250127::(anonymous_namespace)::kAsciiToInt[(byte)*pnVar12];
        lVar10 = (long)((char)lts_20250127::(anonymous_namespace)::kAsciiToInt[(byte)*pnVar12] >> 7)
        ;
        if ((SBORROW8(lVar10,local_60) != SBORROW8(lVar10 - local_60,(ulong)(uVar11 < local_58))) ==
            (long)((lVar10 - local_60) - (ulong)(uVar11 < local_58)) < 0) break;
        uVar9 = (ulong)(auVar13._0_8_ < uVar9);
        if ((SBORROW8(lVar8,uVar5) != SBORROW8(lVar8 - uVar5,uVar9)) !=
            (long)((lVar8 - uVar5) - uVar9) < 0) {
          *puVar6 = 0xffffffffffffffff;
          puVar6[1] = 0x7fffffffffffffff;
          goto LAB_002ce23e;
        }
        local_68 = CONCAT44(local_68._4_4_,(int)uVar7);
        other.v_._7_1_ = in_stack_ffffffffffffff7f;
        other.v_._0_7_ = in_stack_ffffffffffffff78;
        other.v_._8_8_ = puVar6;
        int128::operator*=(&local_78,other);
        lVar2 = (0x7fffffffffffffff - lVar10) - local_78.v_._8_8_;
        if ((SBORROW8(0x7fffffffffffffff - lVar10,local_78.v_._8_8_) !=
            SBORROW8(lVar2,(ulong)(~uVar11 < (ulong)local_78.v_))) !=
            (long)(lVar2 - (ulong)(~uVar11 < (ulong)local_78.v_)) < 0) {
          *puVar6 = 0xffffffffffffffff;
          puVar6[1] = 0x7fffffffffffffff;
          uVar7 = local_68 & 0xffffffff;
          goto LAB_002ce23e;
        }
        uVar9 = (ulong)local_78.v_ + uVar11;
        uVar5 = lVar10 + local_78.v_._8_8_ + (ulong)CARRY8((ulong)local_78.v_,uVar11);
        unaff_RBP = lVar8;
        local_78.v_._0_8_ = uVar9;
        local_78.v_._8_8_ = uVar5;
      }
    }
    else {
      local_78.v_._0_8_ = 0;
      local_78.v_._8_8_ = 0;
      uVar7 = *(ulong *)(lts_20250127::(anonymous_namespace)::
                         LookupTables<absl::lts_20250127::int128>::kVminOverBase + local_58 * 0x10);
      lVar8 = *(long *)(lts_20250127::(anonymous_namespace)::
                        LookupTables<absl::lts_20250127::int128>::kVminOverBase +
                       local_58 * 0x10 + 8);
      local_68 = uVar7;
      local_60 = lVar8;
      if (1 < (int)local_44) {
        auVar14 = __udivti3(0,0x8000000000000000,local_58);
        local_68 = -auVar14._0_8_;
        local_60 = -(ulong)(auVar14._0_8_ != 0) - auVar14._8_8_;
        if (uVar7 != local_68 || lVar8 != local_60) {
          __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/numbers.cc"
                        ,0x403,
                        "bool absl::lts_20250127::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = absl::int128]"
                       );
        }
      }
      local_50 = local_50 + (long)pnVar12;
      uVar9 = 0;
      uVar5 = 0;
      for (; uVar7 = (ulong)(local_50 <= pnVar12), local_50 > pnVar12; pnVar12 = pnVar12 + 1) {
        cVar1 = lts_20250127::(anonymous_namespace)::kAsciiToInt[(byte)*pnVar12];
        if ((int)uVar3 <= (int)cVar1) break;
        if ((SBORROW8(uVar9,local_60) != SBORROW8(uVar9 - local_60,(ulong)(uVar5 < local_68))) !=
            (long)((uVar9 - local_60) - (ulong)(uVar5 < local_68)) < 0) {
LAB_002ce1fb:
          *puVar6 = 0;
          puVar6[1] = 0x8000000000000000;
          goto LAB_002ce23e;
        }
        uVar11 = (ulong)(int)cVar1;
        other_00.v_._7_1_ = in_stack_ffffffffffffff7f;
        other_00.v_._0_7_ = in_stack_ffffffffffffff78;
        other_00.v_._8_8_ = puVar6;
        int128::operator*=(&local_78,other_00);
        uVar9 = (long)(cVar1 >> 7) ^ 0x8000000000000000;
        lVar8 = local_78.v_._8_8_ - uVar9;
        if ((SBORROW8(local_78.v_._8_8_,uVar9) !=
            SBORROW8(lVar8,(ulong)((ulong)local_78.v_ < uVar11))) !=
            (long)(lVar8 - (ulong)((ulong)local_78.v_ < uVar11)) < 0) goto LAB_002ce1fb;
        uVar5 = (ulong)local_78.v_ - uVar11;
        uVar9 = (local_78.v_._8_8_ - (long)(cVar1 >> 7)) - (ulong)((ulong)local_78.v_ < uVar11);
        local_78.v_._0_8_ = uVar5;
        local_78.v_._8_8_ = uVar9;
      }
    }
    *puVar6 = (ulong)local_78.v_;
    puVar6[1] = local_78.v_._8_8_;
  }
  else {
    uVar7 = 0;
  }
LAB_002ce23e:
  return (bool)(char)uVar7;
}

Assistant:

bool safe_strto128_base(absl::string_view text, absl::Nonnull<int128*> value,
                        int base) {
  return safe_int_internal<absl::int128>(text, value, base);
}